

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

int __thiscall
section_data::slice_horiz_angled(section_data *this,int *line_start,int *line_end,int *layer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  intercept_data intercept;
  
  iVar5 = *line_start;
  iVar6 = line_start[1];
  uVar1 = this->x1;
  uVar3 = this->y1;
  dVar7 = (double)(int)uVar1;
  dVar8 = (double)(int)uVar3;
  uVar2 = this->x2;
  uVar4 = this->y2;
  dVar8 = round(((double)iVar6 -
                ((dVar7 * dVar8 - (double)(int)uVar4 * dVar7) / ((double)(int)uVar2 - dVar7) + dVar8
                )) / (((double)(int)uVar4 - dVar8) / ((double)(int)uVar2 - dVar7)));
  if (((double)iVar5 <= dVar8) && (dVar8 <= (double)*line_end)) {
    dVar7 = round(SQRT((dVar8 - dVar7) * (dVar8 - dVar7) +
                       (double)((iVar6 - uVar3) * (iVar6 - uVar3))));
    intercept.y = iVar6;
    intercept.x = (int)dVar8;
    intercept.dist = (int)dVar7;
    push_intercept(this,layer,intercept);
  }
  return 0;
}

Assistant:

int section_data::slice_horiz_angled(int line_start[2], int line_end[2],
                                     int &layer)
{
  double xa = (double)line_start[0];
  double xb = (double)line_end[0];
  double ya = (double)line_start[1];
  intercept_data tempy;
  // Solve linear equation
  double c =
      (double)y1 + (((double)x1 * (double)y1) - ((double)x1 * (double)y2)) /
                       ((double)x2 - (double)x1);
  double m = (((double)y2 - (double)y1) / ((double)x2 - (double)x1));
  // y = mx + c    -    Solve for x using y value of horizontal line
  // x = (ya-c)/m  -    Does x lie within boundary of [xa,xb]
  double x_intercept = round(((double)ya - c) / m);
  // if it does, calculate the distance from x1 [x1 always origin, x1 always LE
  // x2]
  if ((x_intercept >= xa) && (x_intercept <= xb)) {
    double distance = round(sqrt((x_intercept - x1) * (x_intercept - x1) +
                                 (line_start[1] - y1) * (line_start[1] - y1)));
    tempy.x = (int)x_intercept;
    tempy.y = (int)ya;
    tempy.dist = (int)distance;
    push_intercept(layer, tempy); // round to nearest database unit (nm)
  }
  return EXIT_SUCCESS;
}